

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O3

YSRESULT __thiscall YsSoundPlayer::SoundData::LoadWav(SoundData *this,BinaryInStream *inStream)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  uchar *puVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  uchar buf [256];
  uint local_144;
  byte local_138;
  byte bStack_137;
  byte bStack_136;
  int iStack_135;
  undefined1 uStack_131;
  uint local_130;
  ushort local_12c;
  ushort local_12a;
  ushort local_128;
  
  CleanUp(this);
  iVar4 = (**inStream->_vptr_BinaryInStream)(inStream,&local_138,4);
  if (CONCAT44(extraout_var,iVar4) == 4) {
    if (CONCAT13((byte)iStack_135,CONCAT12(bStack_136,CONCAT11(bStack_137,local_138))) != 0x46464952
       ) {
      puts("Warning: RIFF not found.");
    }
    iVar4 = (**inStream->_vptr_BinaryInStream)(inStream,&local_138,4);
    if (CONCAT44(extraout_var_00,iVar4) == 4) {
      printf("File Size=%d\n",
             (ulong)(CONCAT13((byte)iStack_135,CONCAT12(bStack_136,CONCAT11(bStack_137,local_138)))
                    + 8));
      iVar4 = (**inStream->_vptr_BinaryInStream)(inStream,&local_138,8);
      if (CONCAT44(extraout_var_01,iVar4) == 8) {
        if (iStack_135 != 0x746d6645 ||
            CONCAT13((byte)iStack_135,CONCAT12(bStack_136,CONCAT11(bStack_137,local_138))) !=
            0x45564157) {
          puts("Warning: WAVEfmt not found");
        }
        iVar4 = (**inStream->_vptr_BinaryInStream)(inStream,&local_138,4);
        if (CONCAT44(extraout_var_02,iVar4) == 4) {
          uVar7 = CONCAT13((byte)iStack_135,CONCAT12(bStack_136,CONCAT11(bStack_137,local_138)));
          uVar9 = (ulong)uVar7;
          printf("Header Size=%d\n",uVar9);
          iVar4 = (**inStream->_vptr_BinaryInStream)(inStream,&local_138,uVar9);
          if (CONCAT44(extraout_var_03,iVar4) == uVar9) {
            uVar2 = CONCAT11((byte)iStack_135,bStack_136);
            uVar3 = CONCAT13(uStack_131,iStack_135._1_3_);
            if (uVar7 < 0x10) {
              local_144 = 0;
              uVar7 = 0;
            }
            else {
              if (uVar7 < 0x12) {
                local_144 = 0;
              }
              else {
                local_144 = (uint)local_128;
              }
              uVar7 = (uint)local_12a;
            }
            printf("wFormatTag=%d\n",(ulong)CONCAT11(bStack_137,local_138));
            printf("nChannels=%d\n",(ulong)(uint)uVar2);
            printf("nSamplesPerSec=%d\n",(ulong)uVar3);
            printf("nAvgBytesPerSec=%d\n",(ulong)local_130);
            printf("nBlockAlign=%d\n",(ulong)local_12c);
            printf("wBitsPerSample=%d\n",(ulong)uVar7);
            printf("cbSize=%d\n",(ulong)local_144);
            do {
              iVar4 = (**inStream->_vptr_BinaryInStream)(inStream,&local_138,4);
              if (CONCAT44(extraout_var_04,iVar4) != 4) {
                pcVar8 = "Error while waiting for data.";
                goto LAB_0011197e;
              }
              if ((((local_138 & 0xdf) == 0x44) &&
                  ((bStack_136 & 0xdf) == 0x54 && (bStack_137 & 0xdf) == 0x41)) &&
                 (((byte)iStack_135 & 0xdf) == 0x41)) {
                iVar4 = (**inStream->_vptr_BinaryInStream)(inStream,&local_138,4);
                if (CONCAT44(extraout_var_07,iVar4) == 4) {
                  uVar1 = CONCAT13((byte)iStack_135,
                                   CONCAT12(bStack_136,CONCAT11(bStack_137,local_138)));
                  uVar9 = (ulong)uVar1;
                  printf("Data Size=%d (0x%x)\n",uVar9,(ulong)uVar1);
                  puVar6 = (uchar *)operator_new__(uVar9);
                  this->dat = puVar6;
                  uVar5 = (**inStream->_vptr_BinaryInStream)(inStream,puVar6,uVar9);
                  if (uVar1 != uVar5) {
                    puts("Warning: File ended before reading all data.");
                    printf("  %d (0x%x) bytes have been read\n",(ulong)uVar5,(ulong)uVar5);
                  }
                  this->stereo = (uint)(uVar2 == 2);
                  this->bit = uVar7;
                  this->sizeInBytes = uVar1;
                  this->rate = uVar3;
                  if (uVar7 == 8) {
                    this->isSigned = YSFALSE;
                  }
                  else {
                    this->isSigned = YSTRUE;
                  }
                  return YSOK;
                }
                pcVar8 = "Error in reading data size.";
                goto LAB_0011197e;
              }
              printf("Skipping %c%c%c%c (Unknown Block)\n",(ulong)local_138,(ulong)bStack_137,
                     (ulong)bStack_136,(ulong)(byte)iStack_135);
              iVar4 = (**inStream->_vptr_BinaryInStream)(inStream,&local_138,4);
              if (CONCAT44(extraout_var_05,iVar4) != 4) break;
              uVar9 = (ulong)CONCAT13((byte)iStack_135,
                                      CONCAT12(bStack_136,CONCAT11(bStack_137,local_138)));
              iVar4 = (*inStream->_vptr_BinaryInStream[1])(inStream,uVar9);
            } while (CONCAT44(extraout_var_06,iVar4) == uVar9);
            pcVar8 = "Error while skipping unknown block.";
            goto LAB_0011197e;
          }
          pcVar8 = "Error in reading header.";
        }
        else {
          pcVar8 = "Error in reading header size.";
        }
      }
      else {
        pcVar8 = "Error in reading WAVEfmt.";
      }
      puts(pcVar8);
      return YSERR;
    }
    pcVar8 = "Error in reading file size.";
  }
  else {
    pcVar8 = "Error in reading RIFF.";
  }
LAB_0011197e:
  puts(pcVar8);
  return YSERR;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::LoadWav(BinaryInStream &inStream)
{
	CleanUp();

	unsigned char buf[256];
	unsigned int l;
	unsigned int fSize,hdrSize,dataSize;

	// Wave Header
	unsigned short wFormatTag,nChannels;
	unsigned nSamplesPerSec,nAvgBytesPerSec;
	unsigned short nBlockAlign,wBitsPerSample,cbSize;


	if(inStream.Fetch(buf,4)!=4)
	{
		printf("Error in reading RIFF.\n");
		return YSERR;
	}
	if(strncmp((char *)buf,"RIFF",4)!=0)
	{
		printf("Warning: RIFF not found.\n");
	}


	if(inStream.Fetch(buf,4)!=4)
	{
		printf("Error in reading file size.\n");
		return YSERR;
	}
	fSize=GetUnsigned(buf);
	printf("File Size=%d\n",fSize+8);
	// Wait, is it fSize+12?  A new theory tells that "fmt " immediately following "WAVE"
	// is a chunk???

	if(inStream.Fetch(buf,8)!=8)
	{
		printf("Error in reading WAVEfmt.\n");
		return YSERR;
	}
	if(strncmp((char *)buf,"WAVEfmt",7)!=0)
	{
		printf("Warning: WAVEfmt not found\n");
	}


	if(inStream.Fetch(buf,4)!=4)
	{
		printf("Error in reading header size.\n");
		return YSERR;
	}
	hdrSize=GetUnsigned(buf);
	printf("Header Size=%d\n",hdrSize);


	//    WORD  wFormatTag; 
	//    WORD  nChannels; 
	//    DWORD nSamplesPerSec; 
	//    DWORD nAvgBytesPerSec; 
	//    WORD  nBlockAlign; 
	//    WORD  wBitsPerSample; 
	//    WORD  cbSize; 
	if(inStream.Fetch(buf,hdrSize)!=hdrSize)
	{
		printf("Error in reading header.\n");
		return YSERR;
	}
	wFormatTag=GetUnsignedShort(buf);
	nChannels=GetUnsignedShort(buf+2);
	nSamplesPerSec=GetUnsigned(buf+4);
	nAvgBytesPerSec=GetUnsigned(buf+8);
	nBlockAlign=GetUnsignedShort(buf+12);
	wBitsPerSample=(hdrSize>=16 ? GetUnsignedShort(buf+14) : 0);
	cbSize=(hdrSize>=18 ? GetUnsignedShort(buf+16) : 0);

	printf("wFormatTag=%d\n",wFormatTag);
	printf("nChannels=%d\n",nChannels);
	printf("nSamplesPerSec=%d\n",nSamplesPerSec);
	printf("nAvgBytesPerSec=%d\n",nAvgBytesPerSec);
	printf("nBlockAlign=%d\n",nBlockAlign);
	printf("wBitsPerSample=%d\n",wBitsPerSample);
	printf("cbSize=%d\n",cbSize);



	for(;;)
	{
		if(inStream.Fetch(buf,4)!=4)
		{
			printf("Error while waiting for data.\n");
			return YSERR;
		}

		if((buf[0]=='d' || buf[0]=='D') && (buf[1]=='a' || buf[1]=='A') &&
		   (buf[2]=='t' || buf[2]=='T') && (buf[3]=='a' || buf[3]=='A'))
		{
			break;
		}
		else
		{
			printf("Skipping %c%c%c%c (Unknown Block)\n",buf[0],buf[1],buf[2],buf[3]);
			if(inStream.Fetch(buf,4)!=4)
			{
				printf("Error while skipping unknown block.\n");
				return YSERR;
			}



			l=GetUnsigned(buf);
			if(inStream.Skip(l)!=l)
			{
				printf("Error while skipping unknown block.\n");
				return YSERR;
			}
		}
	}


	if(inStream.Fetch(buf,4)!=4)
	{
		printf("Error in reading data size.\n");
		return YSERR;
	}
	dataSize=GetUnsigned(buf);
	printf("Data Size=%d (0x%x)\n",dataSize,dataSize);

	dat=new unsigned char [dataSize];
	if((l=inStream.Fetch(dat,dataSize))!=dataSize)
	{
		printf("Warning: File ended before reading all data.\n");
		printf("  %d (0x%x) bytes have been read\n",l,l);
	}

	this->stereo=(nChannels==2 ? YSTRUE : YSFALSE);
	this->bit=wBitsPerSample;
	this->sizeInBytes=dataSize;
	this->rate=nSamplesPerSec;

	if(wBitsPerSample==8)
	{
		isSigned=YSFALSE;
	}
	else
	{
		isSigned=YSTRUE;
	}

	return YSOK;
}